

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptVectorTemplateType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  HlslParseContext *pHVar4;
  _func_int **pp_Var5;
  TPrecisionQualifier precision;
  TBasicType basicType;
  TIntermTyped *vecSize;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokVector);
  if (!bVar1) {
    return false;
  }
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
  if (!bVar1) {
    TType::TType(type,EbtFloat,EvqTemporary,4,0,0,false);
    return true;
  }
  bVar1 = acceptTemplateVecMatBasicType(this,&basicType,&precision);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
    if (bVar1) {
      bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
      if (bVar1) {
        bVar1 = acceptLiteral(this,&vecSize);
        if (!bVar1) {
          return false;
        }
        iVar2 = (*(vecSize->super_TIntermNode)._vptr_TIntermNode[5])();
        iVar2 = **(int **)(*(long *)(CONCAT44(extraout_var,iVar2) + 0xc0) + 8);
        TType::TType(type,basicType,EvqTemporary,precision,iVar2,0,0,false);
        if (iVar2 == 1) {
          type->field_0xa = type->field_0xa | 0x10;
        }
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
        if (bVar1) {
          return bVar1;
        }
        pHVar4 = this->parseContext;
        pp_Var5 = (pHVar4->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar3 = "right angle bracket";
        goto LAB_0042e454;
      }
      pHVar4 = this->parseContext;
      pp_Var5 = (pHVar4->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar3 = "literal integer";
    }
    else {
      pHVar4 = this->parseContext;
      pp_Var5 = (pHVar4->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar3 = ",";
    }
  }
  else {
    pHVar4 = this->parseContext;
    pp_Var5 = (pHVar4->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar3 = "scalar type";
  }
  bVar1 = false;
LAB_0042e454:
  (*pp_Var5[0x2d])(pHVar4,&(this->super_HlslTokenStream).token,"Expected",pcVar3,"");
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptVectorTemplateType(TType& type)
{
    if (! acceptTokenClass(EHTokVector))
        return false;

    if (! acceptTokenClass(EHTokLeftAngle)) {
        // in HLSL, 'vector' alone means float4.
        new(&type) TType(EbtFloat, EvqTemporary, 4);
        return true;
    }

    TBasicType basicType;
    TPrecisionQualifier precision;
    if (! acceptTemplateVecMatBasicType(basicType, precision)) {
        expected("scalar type");
        return false;
    }

    // COMMA
    if (! acceptTokenClass(EHTokComma)) {
        expected(",");
        return false;
    }

    // integer
    if (! peekTokenClass(EHTokIntConstant)) {
        expected("literal integer");
        return false;
    }

    TIntermTyped* vecSize;
    if (! acceptLiteral(vecSize))
        return false;

    const int vecSizeI = vecSize->getAsConstantUnion()->getConstArray()[0].getIConst();

    new(&type) TType(basicType, EvqTemporary, precision, vecSizeI);

    if (vecSizeI == 1)
        type.makeVector();

    if (!acceptTokenClass(EHTokRightAngle)) {
        expected("right angle bracket");
        return false;
    }

    return true;
}